

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<MyTestType,false,std::allocator<unsigned_long>>::
assign<unsigned_long*,unsigned_long_const*>
          (View<MyTestType,false,std::allocator<unsigned_long>> *this,unsigned_long *begin,
          unsigned_long *end,unsigned_long *it,pointer data,CoordinateOrder *internalCoordinateOrder
          ,allocator_type *allocator)

{
  allocator<unsigned_long> local_71;
  Geometry<std::allocator<unsigned_long>_> local_70;
  CoordinateOrder *local_38;
  CoordinateOrder *internalCoordinateOrder_local;
  pointer data_local;
  unsigned_long *it_local;
  unsigned_long *end_local;
  unsigned_long *begin_local;
  View<MyTestType,_false,_std::allocator<unsigned_long>_> *this_local;
  
  local_38 = internalCoordinateOrder;
  internalCoordinateOrder_local = (CoordinateOrder *)data;
  data_local = (pointer)it;
  it_local = end;
  end_local = begin;
  begin_local = (unsigned_long *)this;
  std::allocator<unsigned_long>::allocator<MyTestType>(&local_71,allocator);
  marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<unsigned_long*,unsigned_long_const*>
            ((Geometry<std::allocator<unsigned_long>> *)&local_70,begin,end,it,
             internalCoordinateOrder,&local_71);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
            ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&local_70);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_70);
  std::allocator<unsigned_long>::~allocator(&local_71);
  *(CoordinateOrder **)this = internalCoordinateOrder_local;
  View<MyTestType,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<MyTestType,_false,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline void
View<T, isConst, A>::assign
(
    ShapeIterator begin,
    ShapeIterator end,
    StrideIterator it,
    pointer data,
    const CoordinateOrder& internalCoordinateOrder,
    const allocator_type& allocator
)
{
    // the invariant is not tested as a pre-condition of this
    // function to allow for unsafe manipulations prior to its
    // call
    geometry_ = typename marray_detail::Geometry<A>(begin, end, 
        it, internalCoordinateOrder, allocator);
    data_ = data;
    testInvariant();
}